

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageNextXrGetSystemProperties
                   (XrInstance instance,XrSystemId systemId,XrSystemProperties *properties)

{
  XrResult XVar1;
  GenValidUsageXrInstanceInfo *pGVar2;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  XrResult result;
  XrSystemProperties *properties_local;
  XrSystemId systemId_local;
  XrInstance instance_local;
  
  pGVar2 = HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>::get
                     (&g_instance_info.
                       super_HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>,instance);
  XVar1 = (*pGVar2->dispatch_table->GetSystemProperties)(instance,systemId,properties);
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL GenValidUsageNextXrGetSystemProperties(
    XrInstance instance,
    XrSystemId systemId,
    XrSystemProperties* properties) {
    XrResult result = XR_SUCCESS;
    try {
        GenValidUsageXrInstanceInfo *gen_instance_info = g_instance_info.get(instance);
        result = gen_instance_info->dispatch_table->GetSystemProperties(instance, systemId, properties);
    } catch (...) {
        result = XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}